

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

size_t __thiscall caffe::InnerProductParameter::ByteSizeLong(InnerProductParameter *this)

{
  int iVar1;
  uint uVar2;
  UnknownFieldSet *unknown_fields;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar5 = 0;
  }
  else {
    unknown_fields = InnerProductParameter::unknown_fields(this);
    sVar5 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 0x3f) != 0) {
    if ((uVar2 & 1) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<caffe::FillerParameter>(this->weight_filler_);
      sVar5 = sVar5 + sVar3 + 1;
      uVar2 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar2 & 2) != 0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<caffe::FillerParameter>(this->bias_filler_);
      sVar5 = sVar5 + sVar3 + 1;
      uVar2 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar2 & 4) != 0) {
      uVar4 = this->num_output_ | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar5 = sVar5 + (iVar1 * 9 + 0x49U >> 6) + 1;
    }
    sVar5 = ((uVar2 >> 3 & 2) + (uVar2 >> 2 & 2)) + sVar5;
    if ((uVar2 & 0x20) != 0) {
      sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->axis_);
      sVar5 = sVar5 + sVar3 + 1;
    }
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t InnerProductParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.InnerProductParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 63u) {
    // optional .caffe.FillerParameter weight_filler = 3;
    if (has_weight_filler()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->weight_filler_);
    }

    // optional .caffe.FillerParameter bias_filler = 4;
    if (has_bias_filler()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->bias_filler_);
    }

    // optional uint32 num_output = 1;
    if (has_num_output()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->num_output());
    }

    // optional bool transpose = 6 [default = false];
    if (has_transpose()) {
      total_size += 1 + 1;
    }

    // optional bool bias_term = 2 [default = true];
    if (has_bias_term()) {
      total_size += 1 + 1;
    }

    // optional int32 axis = 5 [default = 1];
    if (has_axis()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->axis());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}